

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

void __thiscall argh::parser::parse(parser *this,int argc,char **argv,int mode)

{
  char __c;
  bool bVar1;
  uint uVar2;
  iterator iVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  bool local_272;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  byte local_1c9;
  iterator iStack_1c8;
  bool preferParam;
  _Base_ptr local_1c0;
  allocator<char> local_1b2;
  char local_1b1;
  char *local_1b0;
  undefined8 local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  reference local_180;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  string local_158;
  string local_138 [8];
  string keep_param;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_70;
  size_type equalPos;
  string name;
  uint i;
  int mode_local;
  char **argv_local;
  int argc_local;
  parser *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->args_,(long)argc);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&this->args_);
  std::
  transform<char_const*const*,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,argh::parser::parse(int,char_const*const*,int)::_lambda(char_const*)_1_>
            (argv,argv + argc,iVar3._M_current);
  name.field_2._12_4_ = 0;
  do {
    uVar9 = (ulong)(uint)name.field_2._12_4_;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->args_);
    if (sVar4 <= uVar9) {
      return;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->args_,(ulong)(uint)name.field_2._12_4_);
    bVar1 = is_option(this,pvVar5);
    if (bVar1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->args_,(ulong)(uint)name.field_2._12_4_);
      trim_leading_dashes((string *)&equalPos,this,pvVar5);
      if (((mode & 4U) == 0) &&
         (local_70 = std::__cxx11::string::find((char)&equalPos,0x3d), local_70 != -1)) {
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)&equalPos);
        std::__cxx11::string::substr((ulong)&local_100,(ulong)&equalPos);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_b0,&local_d0,&local_100);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert(&this->params_,&local_b0);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_b0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_d0);
        keep_param.field_2._12_4_ = 4;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->args_,(ulong)(uint)name.field_2._12_4_);
        lVar6 = std::__cxx11::string::size();
        lVar7 = std::__cxx11::string::size();
        if ((lVar6 - lVar7 == 1) &&
           (((mode & 8U) != 0 && (bVar1 = is_param(this,(string *)&equalPos), !bVar1)))) {
          std::__cxx11::string::string(local_138);
          uVar2 = std::__cxx11::string::empty();
          __range3._6_1_ = 0;
          __range3._5_1_ = 0;
          local_272 = false;
          if ((uVar2 & 1) == 0) {
            pcVar8 = (char *)std::__cxx11::string::back();
            __c = *pcVar8;
            std::allocator<char>::allocator();
            __range3._6_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_158,1,__c,(allocator<char> *)((long)&__range3 + 7));
            __range3._5_1_ = 1;
            local_272 = is_param(this,&local_158);
          }
          if ((__range3._5_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_158);
          }
          if ((__range3._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
          }
          if (local_272 != false) {
            pcVar8 = (char *)std::__cxx11::string::back();
            std::__cxx11::string::operator+=(local_138,*pcVar8);
            std::__cxx11::string::size();
            std::__cxx11::string::resize((ulong)&equalPos);
          }
          __end3._M_current = (char *)std::__cxx11::string::begin();
          c = (char *)std::__cxx11::string::end();
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&c), bVar1) {
            local_180 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&__end3);
            local_1b1 = *local_180;
            local_1b0 = &local_1b1;
            local_1a8 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1a0,local_1b0,local_1a8,&local_1b2);
            local_1c0 = (_Base_ptr)
                        std::
                        multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::emplace<std::__cxx11::string>
                                  ((multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)&this->flags_,&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator(&local_1b2);
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end3);
          }
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            std::__cxx11::string::operator=((string *)&equalPos,local_138);
            keep_param.field_2._12_4_ = 0;
          }
          else {
            keep_param.field_2._12_4_ = 4;
          }
          std::__cxx11::string::~string(local_138);
          if (keep_param.field_2._12_4_ != 0) goto LAB_0010b05b;
        }
        uVar9 = (ulong)(uint)name.field_2._12_4_;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->args_);
        if (uVar9 != sVar4 - 1) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->args_,(ulong)(name.field_2._12_4_ + 1));
          bVar1 = is_option(this,pvVar5);
          if (!bVar1) {
            if ((mode & 1U) != 0 && (mode & 2U) != 0) {
              __assert_fail("!(mode & argh::parser::PREFER_FLAG_FOR_UNREG_OPTION) || !(mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/include/argh.h"
                            ,0xf6,"void argh::parser::parse(int, const char *const *, int)");
            }
            local_1c9 = (byte)((mode & 2U) >> 1);
            bVar1 = is_param(this,(string *)&equalPos);
            if ((bVar1) || ((local_1c9 & 1) != 0)) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&this->args_,(ulong)(name.field_2._12_4_ + 1));
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        (&local_210,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &equalPos,pvVar5);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert(&this->params_,&local_210);
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(&local_210);
              name.field_2._12_4_ = name.field_2._12_4_ + 1;
              keep_param.field_2._12_4_ = 4;
            }
            else {
              std::
              multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<std::__cxx11::string&>
                        ((multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->flags_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &equalPos);
              keep_param.field_2._12_4_ = 0;
            }
            goto LAB_0010b05b;
          }
        }
        iStack_1c8 = std::
                     multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::emplace<std::__cxx11::string&>
                               ((multiset<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&this->flags_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&equalPos);
        keep_param.field_2._12_4_ = 4;
      }
LAB_0010b05b:
      std::__cxx11::string::~string((string *)&equalPos);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->args_,(ulong)(uint)name.field_2._12_4_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->pos_args_,pvVar5);
    }
    name.field_2._12_4_ = name.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

inline void parser::parse(int argc, const char* const argv[], int mode /*= PREFER_FLAG_FOR_UNREG_OPTION*/)
	{
		// convert to strings
		args_.resize(static_cast<decltype(args_)::size_type>(argc));
		std::transform(argv, argv + argc, args_.begin(), [](const char* const arg) { return arg;  });

		// parse line
		for (auto i = 0u; i < args_.size(); ++i)
		{
			if (!is_option(args_[i]))
			{
				pos_args_.emplace_back(args_[i]);
				continue;
			}

			auto name = trim_leading_dashes(args_[i]);

			if (!(mode & NO_SPLIT_ON_EQUALSIGN))
			{
				auto equalPos = name.find('=');
				if (equalPos != std::string::npos)
				{
					params_.insert({ name.substr(0, equalPos), name.substr(equalPos + 1) });
					continue;
				}
			}

			// if the option is unregistered and should be a multi-flag
			if (1 == (args_[i].size() - name.size()) &&         // single dash
				argh::parser::SINGLE_DASH_IS_MULTIFLAG & mode && // multi-flag mode
				!is_param(name))                                  // unregistered
			{
				std::string keep_param;

				if (!name.empty() && is_param(std::string(1ul, name.back()))) // last char is param
				{
					keep_param += name.back();
					name.resize(name.size() - 1);
				}

				for (auto const& c : name)
				{
					flags_.emplace(std::string{ c });
				}

				if (!keep_param.empty())
				{
					name = keep_param;
				}
				else
				{
					continue; // do not consider other options for this arg
				}
			}

			// any potential option will get as its value the next arg, unless that arg is an option too
			// in that case it will be determined a flag.
			if (i == args_.size() - 1 || is_option(args_[i + 1]))
			{
				flags_.emplace(name);
				continue;
			}

			// if 'name' is a pre-registered option, then the next arg cannot be a free parameter to it is skipped
			// otherwise we have 2 modes:
			// PREFER_FLAG_FOR_UNREG_OPTION: a non-registered 'name' is determined a flag.
			//                               The following value (the next arg) will be a free parameter.
			//
			// PREFER_PARAM_FOR_UNREG_OPTION: a non-registered 'name' is determined a parameter, the next arg
			//                                will be the value of that option.

			assert(!(mode & argh::parser::PREFER_FLAG_FOR_UNREG_OPTION)
				   || !(mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION));

			bool preferParam = mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION;

			if (is_param(name) || preferParam)
			{
				params_.insert({ name, args_[i + 1] });
				++i; // skip next value, it is not a free parameter
				continue;
			}
			else
			{
				flags_.emplace(name);
			}
		};
	}